

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O2

string * __thiscall
helics::generateInterfaceQueryResults
          (string *__return_storage_ptr__,helics *this,string_view request,HandleManager *handles,
          GlobalFederateId fed,
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          *addHeaderInfo)

{
  value_t vVar1;
  _Elt_pointer pBVar2;
  json_value jVar3;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *this_00;
  GlobalFederateId GVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  HandleManager *hm;
  char *pcVar8;
  BasicHandleInfo *ele_1;
  _Elt_pointer pBVar9;
  _Elt_pointer pBVar10;
  int iVar11;
  undefined4 in_register_0000008c;
  BasicHandleInfo *ele;
  BasicHandleInfo *handle;
  bool bVar12;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  initializer_list_t init;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  initializer_list_t init_00;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  initializer_list_t init_01;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  initializer_list_t init_02;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  initializer_list_t init_03;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  _Map_pointer local_e0;
  _Map_pointer local_d0;
  GlobalFederateId fed_local;
  json base;
  string local_a0;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  iVar11 = (int)handles;
  hm = (HandleManager *)request._M_str;
  pcVar8 = (char *)request._M_len;
  this_00 = (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
             *)CONCAT44(in_register_0000008c,fed.gid);
  __x._M_str = pcVar8;
  __x._M_len = (size_t)this;
  __y._M_str = "inputs";
  __y._M_len = 6;
  fed_local.gid = iVar11;
  bVar5 = std::operator==(__x,__y);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
    pBVar9 = (hm->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    pBVar10 = (hm->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    local_d0 = (hm->handles).
               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    pBVar2 = (hm->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pBVar9 != pBVar2) {
      if ((((iVar11 == -2010000000) || (iVar11 == -1700000000)) ||
          ((pBVar9->handle).fed_id.gid == iVar11)) &&
         (((pBVar9->handleType == TRANSLATOR || (pBVar9->handleType == INPUT)) &&
          ((pBVar9->key)._M_string_length != 0)))) {
        std::__cxx11::string::string((string *)&local_a0,&pBVar9->key);
        generateJsonQuotedString((string *)&base,&local_a0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
        std::__cxx11::string::~string((string *)&base);
        std::__cxx11::string::~string((string *)&local_a0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,',');
      }
      pBVar9 = pBVar9 + 1;
      if (pBVar9 == pBVar10) {
        pBVar9 = local_d0[1];
        local_d0 = local_d0 + 1;
        pBVar10 = pBVar9 + 3;
      }
    }
    uVar7 = __return_storage_ptr__->_M_string_length;
    if (uVar7 < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
      return __return_storage_ptr__;
    }
LAB_002b5f43:
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar7 - 1] = ']';
  }
  else {
    __x_00._M_str = pcVar8;
    __x_00._M_len = (size_t)this;
    __y_00._M_str = "input_details";
    __y_00._M_len = 0xd;
    bVar5 = std::operator==(__x_00,__y_00);
    if (bVar5) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&base,(nullptr_t)0x0);
      std::
      function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
      ::operator()(this_00,&base);
      init._M_len = 0;
      init._M_array = (iterator)&local_40;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&base,"inputs");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_40.m_type;
      jVar3 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar1;
      local_40.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      GVar4 = fed_local;
      pBVar9 = (hm->handles).
               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      pBVar10 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_e0 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      pBVar2 = (hm->handles).
               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      bVar5 = fed_local.gid == -2010000000;
      bVar12 = fed_local.gid == -1700000000;
      while (pBVar9 != pBVar2) {
        if ((((GVar4.gid == -2010000000) || (GVar4.gid == -1700000000)) ||
            ((pBVar9->handle).fed_id.gid == GVar4.gid)) &&
           (((pBVar9->handleType == TRANSLATOR || (pBVar9->handleType == INPUT)) &&
            ((pBVar9->key)._M_string_length != 0)))) {
          storeInput(pBVar9,&base,bVar12 || bVar5);
        }
        pBVar9 = pBVar9 + 1;
        if (pBVar9 == pBVar10) {
          pBVar9 = local_e0[1];
          local_e0 = local_e0 + 1;
          pBVar10 = pBVar9 + 3;
        }
      }
      fileops::generateJsonString(__return_storage_ptr__,&base,true);
    }
    else {
      __x_01._M_str = pcVar8;
      __x_01._M_len = (size_t)this;
      __y_01._M_str = "publications";
      __y_01._M_len = 0xc;
      bVar5 = std::operator==(__x_01,__y_01);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
        pBVar9 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pBVar10 = (hm->handles).
                  super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_d0 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        pBVar2 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        while (pBVar9 != pBVar2) {
          if ((((iVar11 == -2010000000) || (iVar11 == -1700000000)) ||
              ((pBVar9->handle).fed_id.gid == iVar11)) &&
             (((pBVar9->handleType | 4) == TRANSLATOR && ((pBVar9->key)._M_string_length != 0)))) {
            std::__cxx11::string::string((string *)&local_a0,&pBVar9->key);
            generateJsonQuotedString((string *)&base,&local_a0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
            std::__cxx11::string::~string((string *)&base);
            std::__cxx11::string::~string((string *)&local_a0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,',');
          }
          pBVar9 = pBVar9 + 1;
          if (pBVar9 == pBVar10) {
            pBVar9 = local_d0[1];
            local_d0 = local_d0 + 1;
            pBVar10 = pBVar9 + 3;
          }
        }
        uVar7 = __return_storage_ptr__->_M_string_length;
        if (uVar7 < 2) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,']');
          return __return_storage_ptr__;
        }
        goto LAB_002b5f43;
      }
      __x_02._M_str = pcVar8;
      __x_02._M_len = (size_t)this;
      __y_02._M_str = "publication_details";
      __y_02._M_len = 0x13;
      bVar5 = std::operator==(__x_02,__y_02);
      if (bVar5) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json(&base,(nullptr_t)0x0);
        std::
        function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
        ::operator()(this_00,&base);
        init_00._M_len = 0;
        init_00._M_array = (iterator)&local_50;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::array(init_00);
        pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&base,"publications");
        vVar1 = (pvVar6->m_data).m_type;
        (pvVar6->m_data).m_type = local_50.m_type;
        jVar3 = (pvVar6->m_data).m_value;
        (pvVar6->m_data).m_value = local_50.m_value;
        local_50.m_type = vVar1;
        local_50.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_50);
        GVar4 = fed_local;
        pBVar9 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pBVar10 = (hm->handles).
                  super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_e0 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        pBVar2 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        bVar5 = fed_local.gid == -2010000000;
        bVar12 = fed_local.gid == -1700000000;
        while (pBVar9 != pBVar2) {
          if ((((GVar4.gid == -2010000000) || (GVar4.gid == -1700000000)) ||
              ((pBVar9->handle).fed_id.gid == GVar4.gid)) &&
             (((pBVar9->handleType | 4) == TRANSLATOR && ((pBVar9->key)._M_string_length != 0)))) {
            storePublication(pBVar9,&base,bVar12 || bVar5);
          }
          pBVar9 = pBVar9 + 1;
          if (pBVar9 == pBVar10) {
            pBVar9 = local_e0[1];
            local_e0 = local_e0 + 1;
            pBVar10 = pBVar9 + 3;
          }
        }
        fileops::generateJsonString(__return_storage_ptr__,&base,true);
      }
      else {
        __x_03._M_str = pcVar8;
        __x_03._M_len = (size_t)this;
        __y_03._M_str = "filters";
        __y_03._M_len = 7;
        bVar5 = std::operator==(__x_03,__y_03);
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
          pBVar9 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pBVar10 = (hm->handles).
                    super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
          local_d0 = (hm->handles).
                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          pBVar2 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          while (pBVar9 != pBVar2) {
            if ((((iVar11 == -2010000000) || (iVar11 == -1700000000)) ||
                ((pBVar9->handle).fed_id.gid == iVar11)) &&
               ((pBVar9->handleType == FILTER && ((pBVar9->key)._M_string_length != 0)))) {
              std::__cxx11::string::string((string *)&local_a0,&pBVar9->key);
              generateJsonQuotedString((string *)&base,&local_a0);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
              std::__cxx11::string::~string((string *)&base);
              std::__cxx11::string::~string((string *)&local_a0);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,',');
            }
            pBVar9 = pBVar9 + 1;
            if (pBVar9 == pBVar10) {
              pBVar9 = local_d0[1];
              local_d0 = local_d0 + 1;
              pBVar10 = pBVar9 + 3;
            }
          }
          uVar7 = __return_storage_ptr__->_M_string_length;
          if (uVar7 < 2) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,']');
            return __return_storage_ptr__;
          }
          goto LAB_002b5f43;
        }
        __x_04._M_str = pcVar8;
        __x_04._M_len = (size_t)this;
        __y_04._M_str = "filter_details";
        __y_04._M_len = 0xe;
        bVar5 = std::operator==(__x_04,__y_04);
        if (bVar5) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json(&base,(nullptr_t)0x0);
          std::
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          ::operator()(this_00,&base);
          init_01._M_len = 0;
          init_01._M_array = (iterator)&local_60;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_01);
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&base,"filters");
          vVar1 = (pvVar6->m_data).m_type;
          (pvVar6->m_data).m_type = local_60.m_type;
          jVar3 = (pvVar6->m_data).m_value;
          (pvVar6->m_data).m_value = local_60.m_value;
          local_60.m_type = vVar1;
          local_60.m_value = jVar3;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_60);
          GVar4 = fed_local;
          pBVar9 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pBVar10 = (hm->handles).
                    super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
          local_e0 = (hm->handles).
                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          pBVar2 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          bVar5 = fed_local.gid == -2010000000;
          bVar12 = fed_local.gid == -1700000000;
          while (pBVar9 != pBVar2) {
            if ((((GVar4.gid == -2010000000) || (GVar4.gid == -1700000000)) ||
                ((pBVar9->handle).fed_id.gid == GVar4.gid)) &&
               ((pBVar9->handleType == FILTER && ((pBVar9->key)._M_string_length != 0)))) {
              storeFilter(pBVar9,&base,bVar12 || bVar5);
            }
            pBVar9 = pBVar9 + 1;
            if (pBVar9 == pBVar10) {
              pBVar9 = local_e0[1];
              local_e0 = local_e0 + 1;
              pBVar10 = pBVar9 + 3;
            }
          }
          fileops::generateJsonString(__return_storage_ptr__,&base,true);
        }
        else {
          __x_05._M_str = pcVar8;
          __x_05._M_len = (size_t)this;
          __y_05._M_str = "translators";
          __y_05._M_len = 0xb;
          bVar5 = std::operator==(__x_05,__y_05);
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
            pBVar9 = (hm->handles).
                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            pBVar10 = (hm->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
            local_d0 = (hm->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node;
            pBVar2 = (hm->handles).
                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            while (pBVar9 != pBVar2) {
              if ((((iVar11 == -2010000000) || (iVar11 == -1700000000)) ||
                  ((pBVar9->handle).fed_id.gid == iVar11)) &&
                 ((pBVar9->handleType == TRANSLATOR && ((pBVar9->key)._M_string_length != 0)))) {
                std::__cxx11::string::string((string *)&local_a0,&pBVar9->key);
                generateJsonQuotedString((string *)&base,&local_a0);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base)
                ;
                std::__cxx11::string::~string((string *)&base);
                std::__cxx11::string::~string((string *)&local_a0);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,',');
              }
              pBVar9 = pBVar9 + 1;
              if (pBVar9 == pBVar10) {
                pBVar9 = local_d0[1];
                local_d0 = local_d0 + 1;
                pBVar10 = pBVar9 + 3;
              }
            }
            uVar7 = __return_storage_ptr__->_M_string_length;
            if (uVar7 < 2) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,']');
              return __return_storage_ptr__;
            }
            goto LAB_002b5f43;
          }
          __x_06._M_str = pcVar8;
          __x_06._M_len = (size_t)this;
          __y_06._M_str = "translator_details";
          __y_06._M_len = 0x12;
          bVar5 = std::operator==(__x_06,__y_06);
          if (bVar5) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json(&base,(nullptr_t)0x0);
            std::
            function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
            ::operator()(this_00,&base);
            init_02._M_len = 0;
            init_02._M_array = (iterator)&local_70;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::array(init_02);
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&base,"translators");
            vVar1 = (pvVar6->m_data).m_type;
            (pvVar6->m_data).m_type = local_70.m_type;
            jVar3 = (pvVar6->m_data).m_value;
            (pvVar6->m_data).m_value = local_70.m_value;
            local_70.m_type = vVar1;
            local_70.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_70);
            GVar4 = fed_local;
            pBVar9 = (hm->handles).
                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            pBVar10 = (hm->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last;
            local_e0 = (hm->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node;
            pBVar2 = (hm->handles).
                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            bVar5 = fed_local.gid == -2010000000;
            bVar12 = fed_local.gid == -1700000000;
            while (pBVar9 != pBVar2) {
              if ((((GVar4.gid == -2010000000) || (GVar4.gid == -1700000000)) ||
                  ((pBVar9->handle).fed_id.gid == GVar4.gid)) &&
                 ((pBVar9->handleType == TRANSLATOR && ((pBVar9->key)._M_string_length != 0)))) {
                storeTranslator(pBVar9,&base,bVar12 || bVar5);
              }
              pBVar9 = pBVar9 + 1;
              if (pBVar9 == pBVar10) {
                pBVar9 = local_e0[1];
                local_e0 = local_e0 + 1;
                pBVar10 = pBVar9 + 3;
              }
            }
            fileops::generateJsonString(__return_storage_ptr__,&base,true);
          }
          else {
            __x_07._M_str = pcVar8;
            __x_07._M_len = (size_t)this;
            __y_07._M_str = "endpoints";
            __y_07._M_len = 9;
            bVar5 = std::operator==(__x_07,__y_07);
            if (bVar5) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
              pBVar9 = (hm->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              pBVar10 = (hm->handles).
                        super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last;
              local_d0 = (hm->handles).
                         super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node;
              pBVar2 = (hm->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              while (pBVar9 != pBVar2) {
                if ((((iVar11 == -2010000000) || (iVar11 == -1700000000)) ||
                    ((pBVar9->handle).fed_id.gid == iVar11)) &&
                   (((pBVar9->handleType == TRANSLATOR || (pBVar9->handleType == ENDPOINT)) &&
                    ((pBVar9->key)._M_string_length != 0)))) {
                  std::__cxx11::string::string((string *)&local_a0,&pBVar9->key);
                  generateJsonQuotedString((string *)&base,&local_a0);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &base);
                  std::__cxx11::string::~string((string *)&base);
                  std::__cxx11::string::~string((string *)&local_a0);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__,',');
                }
                pBVar9 = pBVar9 + 1;
                if (pBVar9 == pBVar10) {
                  pBVar9 = local_d0[1];
                  local_d0 = local_d0 + 1;
                  pBVar10 = pBVar9 + 3;
                }
              }
              uVar7 = __return_storage_ptr__->_M_string_length;
              if (uVar7 < 2) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,']');
                return __return_storage_ptr__;
              }
              goto LAB_002b5f43;
            }
            __x_08._M_str = pcVar8;
            __x_08._M_len = (size_t)this;
            __y_08._M_str = "endpoint_details";
            __y_08._M_len = 0x10;
            bVar5 = std::operator==(__x_08,__y_08);
            if (bVar5) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json(&base,(nullptr_t)0x0);
              std::
              function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              ::operator()(this_00,&base);
              init_03._M_len = 0;
              init_03._M_array = (iterator)&local_80;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::array(init_03);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&base,"endpoints");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_80.m_type;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_80.m_value;
              local_80.m_type = vVar1;
              local_80.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_80);
              GVar4 = fed_local;
              pBVar9 = (hm->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              pBVar10 = (hm->handles).
                        super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last;
              local_e0 = (hm->handles).
                         super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node;
              pBVar2 = (hm->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              bVar5 = fed_local.gid == -2010000000;
              bVar12 = fed_local.gid == -1700000000;
              while (pBVar9 != pBVar2) {
                if (((((GVar4.gid == -2010000000) || (GVar4.gid == -1700000000)) ||
                     ((pBVar9->handle).fed_id.gid == GVar4.gid)) &&
                    ((pBVar9->handleType == TRANSLATOR || (pBVar9->handleType == ENDPOINT)))) &&
                   ((pBVar9->key)._M_string_length != 0)) {
                  storeEndpoint(pBVar9,&base,bVar12 || bVar5);
                }
                pBVar9 = pBVar9 + 1;
                if (pBVar9 == pBVar10) {
                  pBVar9 = local_e0[1];
                  local_e0 = local_e0 + 1;
                  pBVar10 = pBVar9 + 3;
                }
              }
              fileops::generateJsonString(__return_storage_ptr__,&base,true);
            }
            else {
              __x_09._M_str = pcVar8;
              __x_09._M_len = (size_t)this;
              __y_09._M_str = "interface_details";
              __y_09._M_len = 0x11;
              bVar5 = std::operator==(__x_09,__y_09);
              if (!bVar5) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                __return_storage_ptr__->_M_string_length = 0;
                (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                return __return_storage_ptr__;
              }
              generateInterfaceConfig_abi_cxx11_((helics *)&base,hm,&fed_local);
              std::
              function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              ::operator()(this_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)&base);
              fileops::generateJsonString(__return_storage_ptr__,&base,true);
            }
          }
        }
      }
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&base.m_data);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateInterfaceQueryResults(std::string_view request,
                                          const HandleManager& handles,
                                          const GlobalFederateId fed,
                                          const std::function<void(nlohmann::json&)>& addHeaderInfo)
{
    if (request == "inputs") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::INPUT ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "input_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["inputs"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::INPUT ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storeInput(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "publications") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::PUBLICATION ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "publication_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["publications"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::PUBLICATION ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storePublication(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "filters") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        handle.handleType == InterfaceType::FILTER && !handle.key.empty());
            });
    }
    if (request == "filter_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["filters"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                handle.handleType == InterfaceType::FILTER && !handle.key.empty()) {
                storeFilter(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "translators") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        handle.handleType == InterfaceType::TRANSLATOR && !handle.key.empty());
            });
    }
    if (request == "translator_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["translators"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                handle.handleType == InterfaceType::TRANSLATOR && !handle.key.empty()) {
                storeTranslator(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "endpoints") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::ENDPOINT ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "endpoint_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["endpoints"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::ENDPOINT ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storeEndpoint(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "interface_details") {
        nlohmann::json base = generateInterfaceConfig(handles, fed);
        addHeaderInfo(base);
        return fileops::generateJsonString(base);
    }

    return std::string{};
}